

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_expandkey(BlowfishContext *ctx,void *vkey,short keybytes,void *vsalt,short saltbytes)

{
  uint *puVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint32_t str [2];
  uchar dummysalt [1];
  undefined8 local_40;
  undefined1 local_31;
  
  if (vsalt == (void *)0x0) {
    vsalt = &local_31;
    local_31 = 0;
    saltbytes = 1;
  }
  for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 4) {
    uVar5 = (uint)*(byte *)((long)vkey + (ulong)(ushort)((short)lVar4 % keybytes)) << 0x18 ^
            *(uint *)((long)ctx->P + lVar4);
    *(uint *)((long)ctx->P + lVar4) = uVar5;
    iVar2 = (int)lVar4;
    uVar5 = (uint)*(byte *)((long)vkey +
                           (ulong)(ushort)((int)((uint)(ushort)((short)(iVar2 + 1U) >> 0xf) << 0x10
                                                | iVar2 + 1U & 0xffff) % (int)keybytes)) << 0x10 ^
            uVar5;
    *(uint *)((long)ctx->P + lVar4) = uVar5;
    uVar5 = (uint)*(byte *)((long)vkey +
                           (ulong)(ushort)((int)((uint)(ushort)((short)(iVar2 + 2U) >> 0xf) << 0x10
                                                | iVar2 + 2U & 0xffff) % (int)keybytes)) << 8 ^
            uVar5;
    *(uint *)((long)ctx->P + lVar4) = uVar5;
    *(uint *)((long)ctx->P + lVar4) =
         *(byte *)((long)vkey +
                  (ulong)(ushort)((int)((uint)(ushort)((short)(iVar2 + 3U) >> 0xf) << 0x10 |
                                       iVar2 + 3U & 0xffff) % (int)keybytes)) ^ uVar5;
  }
  local_40 = 0;
  iVar6 = (int)saltbytes;
  iVar2 = 0;
  for (uVar7 = 0; uVar7 < 0x12; uVar7 = uVar7 + 2) {
    bVar3 = 0;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      puVar1 = (uint *)((long)&local_40 + (ulong)(uVar5 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar2 + uVar5) % iVar6)) <<
                          (~bVar3 & 0x18);
      bVar3 = bVar3 + 8;
    }
    blowfish_encrypt((uint32_t)local_40,local_40._4_4_,(uint32_t *)&local_40,ctx);
    *(undefined8 *)(ctx->P + uVar7) = local_40;
    iVar2 = iVar2 + uVar5;
  }
  for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 2) {
    bVar3 = 0;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      puVar1 = (uint *)((long)&local_40 + (ulong)(uVar5 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar2 + uVar5) % iVar6)) <<
                          (~bVar3 & 0x18);
      bVar3 = bVar3 + 8;
    }
    blowfish_encrypt((uint32_t)local_40,local_40._4_4_,(uint32_t *)&local_40,ctx);
    *(undefined8 *)(ctx->S0 + uVar7) = local_40;
    iVar2 = iVar2 + uVar5;
  }
  for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 2) {
    bVar3 = 0;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      puVar1 = (uint *)((long)&local_40 + (ulong)(uVar5 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar2 + uVar5) % iVar6)) <<
                          (~bVar3 & 0x18);
      bVar3 = bVar3 + 8;
    }
    blowfish_encrypt((uint32_t)local_40,local_40._4_4_,(uint32_t *)&local_40,ctx);
    *(undefined8 *)(ctx->S1 + uVar7) = local_40;
    iVar2 = iVar2 + uVar5;
  }
  for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 2) {
    bVar3 = 0;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      puVar1 = (uint *)((long)&local_40 + (ulong)(uVar5 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar2 + uVar5) % iVar6)) <<
                          (~bVar3 & 0x18);
      bVar3 = bVar3 + 8;
    }
    blowfish_encrypt((uint32_t)local_40,local_40._4_4_,(uint32_t *)&local_40,ctx);
    *(undefined8 *)(ctx->S2 + uVar7) = local_40;
    iVar2 = iVar2 + uVar5;
  }
  for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 2) {
    bVar3 = 0;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      puVar1 = (uint *)((long)&local_40 + (ulong)(uVar5 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar2 + uVar5) % iVar6)) <<
                          (~bVar3 & 0x18);
      bVar3 = bVar3 + 8;
    }
    blowfish_encrypt((uint32_t)local_40,local_40._4_4_,(uint32_t *)&local_40,ctx);
    *(undefined8 *)(ctx->S3 + uVar7) = local_40;
    iVar2 = iVar2 + uVar5;
  }
  return;
}

Assistant:

void blowfish_expandkey(BlowfishContext * ctx,
                        const void *vkey, short keybytes,
                        const void *vsalt, short saltbytes)
{
    const unsigned char *key = (const unsigned char *)vkey;
    const unsigned char *salt = (const unsigned char *)vsalt;
    uint32_t *S0 = ctx->S0;
    uint32_t *S1 = ctx->S1;
    uint32_t *S2 = ctx->S2;
    uint32_t *S3 = ctx->S3;
    uint32_t *P = ctx->P;
    uint32_t str[2];
    int i, j;
    int saltpos;
    unsigned char dummysalt[1];

    saltpos = 0;
    if (!salt) {
        saltbytes = 1;
        salt = dummysalt;
        dummysalt[0] = 0;
    }

    for (i = 0; i < 18; i++) {
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 0) % keybytes])) << 24;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 1) % keybytes])) << 16;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 2) % keybytes])) << 8;
        P[i] ^= ((uint32_t) (unsigned char) (key[(i * 4 + 3) % keybytes]));
    }

    str[0] = str[1] = 0;

    for (i = 0; i < 18; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));

        blowfish_encrypt(str[0], str[1], str, ctx);
        P[i] = str[0];
        P[i + 1] = str[1];
    }

    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S0[i] = str[0];
        S0[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S1[i] = str[0];
        S1[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S2[i] = str[0];
        S2[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S3[i] = str[0];
        S3[i + 1] = str[1];
    }
}